

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::UListLeaf::~UListLeaf
          (UListLeaf *this)

{
  (this->super_Leaf).super_Node._vptr_Node = (_func_int **)&PTR__UListLeaf_009f0eb8;
  Lib::List<Inferences::ALASCA::SuperpositionConf::Lhs>::destroy(this->_children);
  SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node::~Node((Node *)this);
  return;
}

Assistant:

~UListLeaf()
  {
    LDList::destroy(_children);
  }